

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O1

bool miillerTest(BigInt *d,BigInt *n)

{
  bool bVar1;
  bool bVar2;
  BigInt x;
  BigInt N_minus_one;
  BigInt random;
  BigInt local_110;
  BigInt local_f0;
  BigInt local_d0;
  BigInt local_b0;
  BigInt local_90;
  BigInt local_70;
  BigInt local_50;
  
  BigInt::BigInt(&local_d0,2);
  random_bigint(&local_f0,
                (int)((ulong)((long)(n->vector_value).
                                    super__Vector_base<long_long,_std::allocator<long_long>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(n->vector_value).
                                   super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                                   .super__Vector_impl_data._M_start) >> 3));
  BigInt::BigInt(&local_70,4);
  BigInt::operator-(&local_b0,n,&local_70);
  BigInt::operator%(&local_110,&local_f0,&local_b0);
  BigInt::operator+(&local_50,&local_d0,&local_110);
  if (local_110.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  BigInt::operator-(&local_d0,n,&one);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&local_90.vector_value,&d->vector_value);
  local_90.sign = d->sign;
  BigInt::powMod(&local_110,&local_50,&local_90,n);
  if (local_90.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  bVar1 = BigInt::operator==(&local_110,&one);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = BigInt::operator==(&local_110,&local_d0);
    if (!bVar1) {
      do {
        bVar1 = BigInt::operator<(d,&local_d0);
        if (!bVar1) {
          bVar1 = BigInt::operator<(&local_d0,d);
          if (bVar1) goto LAB_00103934;
LAB_001039c0:
          bVar2 = false;
          goto LAB_001039c2;
        }
LAB_00103934:
        BigInt::operator*(&local_b0,&local_110,&local_110);
        BigInt::operator%(&local_f0,&local_b0,n);
        local_110.sign = local_f0.sign;
        std::vector<long_long,_std::allocator<long_long>_>::operator=
                  (&local_110.vector_value,&local_f0.vector_value);
        if (local_f0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f0.vector_value.
                          super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_b0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b0.vector_value.
                          super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_f0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x2;
        BigInt::operator*=(d,(longlong *)&local_f0);
        bVar1 = BigInt::operator==(&local_110,&one);
        if (bVar1) goto LAB_001039c0;
        bVar1 = BigInt::operator==(&local_110,&local_d0);
      } while (!bVar1);
      bVar2 = true;
    }
  }
LAB_001039c2:
  if (local_110.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool miillerTest(BigInt d, BigInt n) {
    //! Pick a random number in [2..n-2]
    //! Corner cases make sure that n > 4
    BigInt random = BigInt(2) + random_bigint(static_cast<int>(n.vector_value.size())) % (n - BigInt(4));

    BigInt N_minus_one = n - one;

    //! Compute a^d % n
    BigInt x = random.powMod(d, n);

    if (x == one || x == N_minus_one)
        return true;

    //! Keep squaring x while one of the following doesn't
    //! happen
    //! (i)   d does not reach n-1
    //! (ii)  (x^2) % n is not 1
    //! (iii) (x^2) % n is not n-1
    while (d != N_minus_one) {
        x = (x * x) % n;
        d *= 2;

        if (x == one) return false;
        if (x == N_minus_one) return true;
    }

    //! Return composite
    return false;
}